

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O0

void __thiscall GslSpan_FromArrayConstructor_Test::TestBody(GslSpan_FromArrayConstructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_3e8;
  Message local_3e0;
  pointer *local_3d8;
  pointer local_3d0;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_16;
  Message local_3b0;
  int local_3a4;
  index_type local_3a0;
  undefined1 local_398 [8];
  AssertionResult gtest_ar_15;
  Message local_380;
  undefined1 local_378 [8];
  AssertionResult gtest_ar_14;
  span<int[3][2],__1L> s_6;
  Message local_350;
  pointer *local_348;
  pointer local_340;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_13;
  Message local_320;
  int local_314;
  index_type local_310;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_12;
  Message local_2f0;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_11;
  span<int[3],__1L> s_5;
  Message local_2c0;
  pointer *local_2b8;
  pointer local_2b0;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_10;
  Message local_290;
  int local_284;
  index_type local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_9;
  Message local_260;
  int local_254;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_8;
  span<int,_5L> s_4;
  Message local_230;
  pointer *local_228;
  pointer local_220;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_7;
  Message local_200;
  int local_1f4;
  index_type local_1f0;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_6;
  span<int[3][2],__1L> s_3;
  int arr3d [2] [3] [2];
  Message local_190;
  pointer *local_188;
  pointer local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_5;
  Message local_160;
  int local_154;
  index_type local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_4;
  span<int[3],__1L> s_2;
  int arr2d [2] [3];
  Message local_108;
  pointer *local_100;
  pointer local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar_3;
  Message local_d8;
  int local_cc;
  index_type local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  span<int,_5L> s_1;
  Message local_a0;
  pointer *local_98;
  pointer local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_1;
  Message local_70 [3];
  int local_54;
  index_type local_50;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  span<int,__1L> s;
  int arr [5];
  GslSpan_FromArrayConstructor_Test *this_local;
  
  s.storage_.data_ = (pointer)0x200000001;
  pstore::gsl::span<int,-1l>::span<5ul>
            ((span<int,_1l> *)&gtest_ar.message_,(element_type (*) [5])&s.storage_.data_);
  local_50 = pstore::gsl::span<int,_-1L>::length((span<int,__1L> *)&gtest_ar.message_);
  local_54 = 5;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_48,"s.length ()","5",&local_50,&local_54);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x11b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  local_90 = pstore::gsl::span<int,_-1L>::data((span<int,__1L> *)&gtest_ar.message_);
  local_98 = &s.storage_.data_;
  testing::internal::EqHelper::Compare<int_*,_int_*,_nullptr>
            ((EqHelper *)local_88,"s.data ()","&arr[0]",&local_90,(int **)&local_98);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&s_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x11c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&s_1,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s_1);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  pstore::gsl::span<int,5l>::span<5ul>
            ((span<int,5l> *)&gtest_ar_2.message_,(element_type (*) [5])&s.storage_.data_);
  local_c8 = pstore::gsl::span<int,_5L>::length((span<int,_5L> *)&gtest_ar_2.message_);
  local_cc = 5;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_c0,"s.length ()","5",&local_c8,&local_cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x120,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_f8 = pstore::gsl::span<int,_5L>::data((span<int,_5L> *)&gtest_ar_2.message_);
  local_100 = &s.storage_.data_;
  testing::internal::EqHelper::Compare<int_*,_int_*,_nullptr>
            ((EqHelper *)local_f0,"s.data ()","&arr[0]",&local_f8,(int **)&local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(arr2d[1] + 1),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x121,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)(arr2d[1] + 1),&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(arr2d[1] + 1));
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  arr2d[0][2] = 5;
  arr2d[1][0] = 6;
  s_2.storage_.data_ = (pointer)0x200000001;
  arr2d[0][0] = 3;
  arr2d[0][1] = 4;
  pstore::gsl::span<int[3],_-1L>::span
            ((span<int[3],__1L> *)&gtest_ar_4.message_,(pointer)&s_2.storage_.data_,1);
  local_150 = pstore::gsl::span<int[3],_-1L>::length((span<int[3],__1L> *)&gtest_ar_4.message_);
  local_154 = 1;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_148,"s.length ()","1",&local_150,&local_154);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x139,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  local_180 = pstore::gsl::span<int[3],_-1L>::data((span<int[3],__1L> *)&gtest_ar_4.message_);
  local_188 = &s_2.storage_.data_;
  testing::internal::EqHelper::Compare<int_(*)[3],_int_(*)[3],_nullptr>
            ((EqHelper *)local_178,"s.data ()","&arr2d[0]",&local_180,(int (**) [3])&local_188);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(arr3d[1] + 2),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x13a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)(arr3d[1] + 2),&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(arr3d[1] + 2));
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  arr3d[1][0][0] = 9;
  arr3d[1][0][1] = 10;
  arr3d[1][1][0] = 0xb;
  arr3d[1][1][1] = 0xc;
  arr3d[0][1][0] = 5;
  arr3d[0][1][1] = 6;
  arr3d[0][2][0] = 7;
  arr3d[0][2][1] = 8;
  s_3.storage_.data_ = (pointer)0x200000001;
  arr3d[0][0][0] = 3;
  arr3d[0][0][1] = 4;
  pstore::gsl::span<int[3][2],_-1L>::span
            ((span<int[3][2],__1L> *)&gtest_ar_6.message_,(pointer)&s_3.storage_.data_,1);
  local_1f0 = pstore::gsl::span<int[3][2],_-1L>::length
                        ((span<int[3][2],__1L> *)&gtest_ar_6.message_);
  local_1f4 = 1;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1e8,"s.length ()","1",&local_1f0,&local_1f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x152,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  local_220 = pstore::gsl::span<int[3][2],_-1L>::data((span<int[3][2],__1L> *)&gtest_ar_6.message_);
  local_228 = &s_3.storage_.data_;
  testing::internal::EqHelper::Compare<int_(*)[3][2],_int_(*)[3][2],_nullptr>
            ((EqHelper *)local_218,"s.data ()","&arr3d[0]",&local_220,(int (**) [3] [2])&local_228);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&s_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x153,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&s_4,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s_4);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  gtest_ar_8.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )pstore::gsl::make_span<int,5ul>((int (*) [5])&s.storage_.data_);
  local_254 = 5;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_250,"decltype (s)::extent","5",&pstore::gsl::span<int,5l>::extent,
             &local_254);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
  if (!bVar1) {
    testing::Message::Message(&local_260);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x157,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_260);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_260);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
  local_280 = pstore::gsl::span<int,_5L>::length((span<int,_5L> *)&gtest_ar_8.message_);
  local_284 = 5;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_278,"s.length ()","5",&local_280,&local_284);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_290);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x158,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_290);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  local_2b0 = pstore::gsl::span<int,_5L>::data((span<int,_5L> *)&gtest_ar_8.message_);
  local_2b8 = &s.storage_.data_;
  testing::internal::EqHelper::Compare<int_*,_int_*,_nullptr>
            ((EqHelper *)local_2a8,"s.data ()","&arr[0]",&local_2b0,(int **)&local_2b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&s_5.storage_.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x159,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&s_5.storage_.data_,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s_5.storage_.data_);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
  join_0x00000010_0x00000000_ =
       (storage_type<pstore::gsl::details::extent_type<_1L>_>)
       pstore::gsl::make_span<int[3]>((int (*) [3])&s_2.storage_.data_,1);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_2e8,"decltype (s)::extent","dynamic_extent",
             &pstore::gsl::span<int[3],-1l>::extent,&pstore::gsl::dynamic_extent);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x15d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  local_310 = pstore::gsl::span<int[3],_-1L>::length((span<int[3],__1L> *)&gtest_ar_11.message_);
  local_314 = 1;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_308,"s.length ()","1",&local_310,&local_314);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x15e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  local_340 = pstore::gsl::span<int[3],_-1L>::data((span<int[3],__1L> *)&gtest_ar_11.message_);
  local_348 = &s_2.storage_.data_;
  testing::internal::EqHelper::Compare<int_(*)[3],_int_(*)[3],_nullptr>
            ((EqHelper *)local_338,"s.data ()","&arr2d[0]",&local_340,(int (**) [3])&local_348);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(&local_350);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&s_6.storage_.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x15f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&s_6.storage_.data_,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&s_6.storage_.data_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  join_0x00000010_0x00000000_ =
       (storage_type<pstore::gsl::details::extent_type<_1L>_>)
       pstore::gsl::make_span<int[3][2]>((int (*) [3] [2])&s_3.storage_.data_,1);
  testing::internal::EqHelper::Compare<long,_long,_nullptr>
            ((EqHelper *)local_378,"decltype (s)::extent","dynamic_extent",
             &pstore::gsl::span<int[3][2],-1l>::extent,&pstore::gsl::dynamic_extent);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_378);
  if (!bVar1) {
    testing::Message::Message(&local_380);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_378);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x163,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_378);
  local_3a0 = pstore::gsl::span<int[3][2],_-1L>::length
                        ((span<int[3][2],__1L> *)&gtest_ar_14.message_);
  local_3a4 = 1;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_398,"s.length ()","1",&local_3a0,&local_3a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x164,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_3b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_3b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  local_3d0 = pstore::gsl::span<int[3][2],_-1L>::data((span<int[3][2],__1L> *)&gtest_ar_14.message_)
  ;
  local_3d8 = &s_3.storage_.data_;
  testing::internal::EqHelper::Compare<int_(*)[3][2],_int_(*)[3][2],_nullptr>
            ((EqHelper *)local_3c8,"s.data ()","&arr3d[0]",&local_3d0,(int (**) [3] [2])&local_3d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_gsl.cpp"
               ,0x165,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  return;
}

Assistant:

TEST (GslSpan, FromArrayConstructor) {
    int arr[5] = {1, 2, 3, 4, 5};

    {
        span<int> s{arr};
        EXPECT_EQ (s.length (), 5);
        EXPECT_EQ (s.data (), &arr[0]);
    }
    {
        span<int, 5> s{arr};
        EXPECT_EQ (s.length (), 5);
        EXPECT_EQ (s.data (), &arr[0]);
    }

    int arr2d[2][3] = {{1, 2, 3}, {4, 5, 6}};

#ifdef CONFIRM_COMPILATION_ERRORS
    { span<int, 6> s{arr}; }
    {
        span<int, 0> s{arr};
        EXPECT_EQ (s.length () == 0 && s.data (), &arr[0]);
    }
    {
        span<int> s{arr2d};
        EXPECT_EQ (s.length () == 6 && s.data (), &arr2d[0][0]);
        EXPECT_EQ (s[0] == 1 && s[5], 6);
    }
    {
        span<int, 0> s{arr2d};
        EXPECT_EQ (s.length () == 0 && s.data (), &arr2d[0][0]);
    }
    { span<int, 6> s{arr2d}; }
#endif
    {
        span<int[3]> s{&(arr2d[0]), 1};
        EXPECT_EQ (s.length (), 1);
        EXPECT_EQ (s.data (), &arr2d[0]);
    }

    int arr3d[2][3][2] = {{{1, 2}, {3, 4}, {5, 6}}, {{7, 8}, {9, 10}, {11, 12}}};

#ifdef CONFIRM_COMPILATION_ERRORS
    {
        span<int> s{arr3d};
        EXPECT_EQ (s.length () == 12 && s.data (), &arr3d[0][0][0]);
        EXPECT_EQ (s[0] == 1 && s[11], 12);
    }
    {
        span<int, 0> s{arr3d};
        EXPECT_EQ (s.length () == 0 && s.data (), &arr3d[0][0][0]);
    }
    { span<int, 11> s{arr3d}; }
    {
        span<int, 12> s{arr3d};
        EXPECT_EQ (s.length () == 12 && s.data (), &arr3d[0][0][0]);
        EXPECT_EQ (s[0] == 1 && s[5], 6);
    }
#endif
    {
        span<int[3][2]> s{&arr3d[0], 1};
        EXPECT_EQ (s.length (), 1);
        EXPECT_EQ (s.data (), &arr3d[0]);
    }
    {
        auto s = make_span (arr);
        EXPECT_EQ (decltype (s)::extent, 5);
        EXPECT_EQ (s.length (), 5);
        EXPECT_EQ (s.data (), &arr[0]);
    }
    {
        auto s = make_span (&(arr2d[0]), 1);
        EXPECT_EQ (decltype (s)::extent, dynamic_extent);
        EXPECT_EQ (s.length (), 1);
        EXPECT_EQ (s.data (), &arr2d[0]);
    }
    {
        auto s = make_span (&arr3d[0], 1);
        EXPECT_EQ (decltype (s)::extent, dynamic_extent);
        EXPECT_EQ (s.length (), 1);
        EXPECT_EQ (s.data (), &arr3d[0]);
    }
}